

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<double>::MultAdd
          (TPZSkylMatrix<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  double **ppdVar4;
  double *pdVar5;
  long lVar6;
  ostream *poVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double extraout_XMM0_Qa;
  double dVar17;
  long local_68;
  
  if (((opt == 0) &&
      ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," <matrixs with incompatible dimensions>");
  }
  lVar2 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow != lVar2) ||
     ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol !=
      (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
              (z,lVar2,(x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  }
  lVar2 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (((lVar2 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) ||
      (lVar2 != (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) ||
     ((lVar2 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow,
      lVar2 != (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow ||
      (lVar2 != (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," y.Cols()",9);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," z.Cols() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," x.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," y.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," z.Rows() ",10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    TPZMatrix<double>::Error
              ("virtual void TPZSkylMatrix<double>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = double]"
               ," incompatible dimensions\n");
  }
  TPZMatrix<double>::PrepareZ(&this->super_TPZMatrix<double>,y,z,beta,opt);
  lVar2 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (0 < lVar2) {
    lVar3 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    local_68 = 0;
    lVar10 = 0;
    do {
      if (0 < lVar3) {
        lVar12 = 8;
        lVar16 = 0;
        do {
          ppdVar4 = (this->fElem).fStore;
          pdVar5 = ppdVar4[lVar16];
          pdVar8 = ppdVar4[lVar16 + 1];
          lVar14 = (long)pdVar8 - (long)pdVar5;
          lVar15 = lVar14 >> 3;
          lVar11 = lVar16 - lVar15;
          lVar6 = (x->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          pdVar9 = x->fElem + lVar6 * lVar10 + lVar11 + 1;
          pdVar8 = pdVar8 + -1;
          dVar17 = 0.0;
          if (pdVar5 < pdVar8) {
            lVar13 = 0;
            do {
              pdVar1 = (double *)((long)pdVar8 + lVar13);
              dVar17 = dVar17 + *pdVar1 * *pdVar9;
              pdVar9 = pdVar9 + 1;
              lVar13 = lVar13 + -8;
            } while (pdVar5 < pdVar1 + -1);
            pdVar8 = (double *)((long)pdVar8 + lVar13);
            pdVar9 = (double *)
                     ((long)x->fElem + ((lVar6 * local_68 + lVar12 + lVar15 * -8) - lVar13));
          }
          if (pdVar8 == pdVar5) {
            dVar17 = dVar17 + *pdVar8 * *pdVar9;
          }
          if (((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
             ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          lVar15 = lVar6 * lVar10;
          z->fElem[lVar15 + lVar16] = dVar17 * alpha + z->fElem[lVar15 + lVar16];
          if ((lVar11 < -1) ||
             ((lVar6 <= lVar11 + 1 ||
              ((z->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar10)))) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (z->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
          pdVar8 = z->fElem;
          (*(x->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(x,lVar16);
          pdVar9 = (double *)((long)(this->fElem).fStore[lVar16] + lVar14 + -8);
          if (pdVar5 < pdVar9) {
            pdVar8 = pdVar8 + lVar6 * lVar10 + lVar11 + 1;
            do {
              *pdVar8 = *pdVar9 * alpha * extraout_XMM0_Qa + *pdVar8;
              pdVar8 = pdVar8 + 1;
              pdVar9 = pdVar9 + -1;
            } while (pdVar5 < pdVar9);
          }
          lVar16 = lVar16 + 1;
          lVar12 = lVar12 + 8;
        } while (lVar16 != lVar3);
      }
      lVar10 = lVar10 + 1;
      local_68 = local_68 + 8;
    } while (lVar10 != lVar2);
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                                  const TVar alpha,const TVar beta ,const int opt) const {
	// Computes z = beta * y + alpha * opt(this)*x
	//          z and x cannot overlap in memory
	
	if (this->fDecomposed != ENoDecompose) {
        //		DebugStop();
	}
	if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," <matrixs with incompatible dimensions>" );
	if(z.Rows() != x.Rows() || z.Cols() != x.Cols()) z.Redim(x.Rows(),x.Cols());
	if(x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows() || x.Rows() != z.Rows()) {
		cout << "x.Cols = " << x.Cols() << " y.Cols()"<< y.Cols() << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows() << " y.Rows() "<< y.Rows() << " z.Rows() "<< z.Rows() << endl;
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__," incompatible dimensions\n");
	}
	this->PrepareZ(y,z,beta,opt);

	const int64_t rows = this->Rows();
	const int64_t xcols = x.Cols();
	for (auto ic = 0; ic < xcols; ic++) {
		for(auto r = 0 ; r < rows ; r++ ) {
			const int64_t offset = Size(r);
			TVar val = 0.;
			const TVar *p = &x.g((r-offset+1),ic);
			TVar *diag = fElem[r] + offset-1;
			const TVar *diaglast = fElem[r];
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) val += *diag-- * *p;
                    else val += std::conj(*diag--) * *p;
                }else{
                    val += *diag-- * *p;
                }
				p ++;
			}
			if( diag == diaglast ) val += *diag * *p;
			z(r,ic) += val*alpha;
			TVar *zp = &z((r-offset+1),ic);
			val = x.GetVal(r,ic);
			diag = fElem[r] + offset-1;
			while( diag > diaglast ) {
                if constexpr (is_complex<TVar>::value){
                    if(opt) *zp += alpha * std::conj(*diag--) * val;
                    else *zp += alpha * *diag-- * val;
                }else{
                    *zp += alpha * *diag-- * val;
                }
                zp ++;
			}
		}
	}
}